

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O2

int decompose_f5_ext_stem(vrna_fold_compound_t *fc,int j,int *stems)

{
  int iVar1;
  
  iVar1 = vrna_fun_zip_add_min
                    ((fc->matrices->field_2).field_0.f5 + 1,stems + 2,
                     (j - (fc->params->model_details).min_loop_size) + -2);
  return iVar1;
}

Assistant:

int
decompose_f5_ext_stem(vrna_fold_compound_t  *fc,
                      int                   j,
                      int                   *stems)
{
  int e, *f5, turn;

  f5    = fc->matrices->f5;
  turn  = fc->params->model_details.min_loop_size;
  e     = INF;

  const int count = j - turn;

  e = vrna_fun_zip_add_min(f5 + 1, stems + 2, count - 2);

  return e;
}